

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O0

int32_t utrie_swapAnyVersion_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    iVar2 = anon_unknown.dwarf_29f722::getVersion(inData,length,'\x01');
    if (iVar2 == 1) {
      ds_local._4_4_ = utrie_swap_63(ds,inData,length,outData,pErrorCode);
    }
    else if (iVar2 == 2) {
      ds_local._4_4_ = utrie2_swap_63(ds,inData,length,outData,pErrorCode);
    }
    else if (iVar2 == 3) {
      ds_local._4_4_ = ucptrie_swap_63(ds,inData,length,outData,pErrorCode);
    }
    else {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_swapAnyVersion(const UDataSwapper *ds,
                     const void *inData, int32_t length, void *outData,
                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) { return 0; }
    switch(getVersion(inData, length, TRUE)) {
    case 1:
        return utrie_swap(ds, inData, length, outData, pErrorCode);
    case 2:
        return utrie2_swap(ds, inData, length, outData, pErrorCode);
    case 3:
        return ucptrie_swap(ds, inData, length, outData, pErrorCode);
    default:
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }
}